

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c++
# Opt level: O1

bool __thiscall kj::_::GlobFilter::matches(GlobFilter *this,StringPtr name)

{
  Vector<unsigned_int> *this_00;
  char c;
  RemoveConst<unsigned_int> *pRVar1;
  uint *puVar2;
  size_t sVar3;
  uint *puVar4;
  ulong uVar5;
  uint *target;
  uint *puVar6;
  ulong uVar7;
  uint uVar8;
  uint *puVar9;
  char *pcVar10;
  bool bVar11;
  Vector<unsigned_int> scratch;
  Vector<unsigned_int> oldStates;
  ArrayBuilder<unsigned_int> local_78;
  uint *local_58;
  uint *puStack_50;
  uint *local_48;
  ArrayDisposer *pAStack_40;
  char *local_38;
  
  pcVar10 = name.content.ptr;
  this_00 = &this->states;
  puVar6 = (this->states).builder.ptr;
  (this->states).builder.pos = puVar6;
  if (puVar6 == (this->states).builder.endPtr) {
    Vector<unsigned_int>::setCapacity(this_00,4);
  }
  pRVar1 = (this->states).builder.pos;
  *pRVar1 = 0;
  (this->states).builder.pos = pRVar1 + 1;
  local_78.ptr = (uint *)0x0;
  local_78.pos = (uint *)0x0;
  local_78.endPtr = (uint *)0x0;
  local_38 = pcVar10 + (name.content.size_ - 1);
  if (local_38 != pcVar10) {
    do {
      c = *pcVar10;
      local_58 = (this->states).builder.ptr;
      puStack_50 = (this->states).builder.pos;
      local_48 = (this->states).builder.endPtr;
      pAStack_40 = (this->states).builder.disposer;
      (this_00->builder).ptr = (uint *)0x0;
      (this->states).builder.pos = (RemoveConst<unsigned_int> *)0x0;
      (this->states).builder.endPtr = (uint *)0x0;
      ArrayBuilder<unsigned_int>::operator=(&this_00->builder,&local_78);
      puVar6 = (this->states).builder.ptr;
      puVar2 = (this->states).builder.endPtr;
      (this->states).builder.pos = puVar6;
      if ((c == '\\') || (puVar9 = local_58, puVar4 = puStack_50, c == '/')) {
        if (puVar6 == puVar2) {
          Vector<unsigned_int>::setCapacity(this_00,4);
        }
        pRVar1 = (this->states).builder.pos;
        *pRVar1 = 0;
        (this->states).builder.pos = pRVar1 + 1;
        puVar9 = local_58;
        puVar4 = puStack_50;
      }
      for (; puVar2 = local_78.endPtr, pRVar1 = local_78.pos, puVar6 = local_78.ptr,
          puVar9 != puVar4; puVar9 = puVar9 + 1) {
        applyState(this,c,*puVar9);
      }
      if (local_78.ptr != (uint *)0x0) {
        local_78.ptr = (uint *)0x0;
        local_78.pos = (RemoveConst<unsigned_int> *)0x0;
        local_78.endPtr = (uint *)0x0;
        (**(local_78.disposer)->_vptr_ArrayDisposer)
                  (local_78.disposer,puVar6,4,(long)pRVar1 - (long)puVar6 >> 2,
                   (long)puVar2 - (long)puVar6 >> 2,0);
      }
      local_78.ptr = local_58;
      local_78.pos = puStack_50;
      local_78.endPtr = local_48;
      local_78.disposer = pAStack_40;
      pcVar10 = pcVar10 + 1;
    } while (pcVar10 != local_38);
  }
  puVar9 = local_78.endPtr;
  pRVar1 = local_78.pos;
  puVar4 = local_78.ptr;
  puVar6 = (this->states).builder.ptr;
  puVar2 = (this->states).builder.pos;
  bVar11 = puVar6 != puVar2;
  if (bVar11) {
    sVar3 = (this->pattern).content.size_;
    uVar7 = 0;
    if (sVar3 != 0) {
      uVar7 = sVar3 - 1;
    }
    do {
      uVar8 = *puVar6;
      do {
        uVar5 = (ulong)uVar8;
        if (uVar7 <= uVar5) break;
        uVar8 = uVar8 + 1;
      } while ((this->pattern).content.ptr[uVar5] == '*');
      if (uVar7 == uVar5) break;
      puVar6 = puVar6 + 1;
      bVar11 = puVar6 != puVar2;
    } while (bVar11);
  }
  if (local_78.ptr != (uint *)0x0) {
    local_78.ptr = (uint *)0x0;
    local_78.pos = (RemoveConst<unsigned_int> *)0x0;
    local_78.endPtr = (uint *)0x0;
    (**(local_78.disposer)->_vptr_ArrayDisposer)
              (local_78.disposer,puVar4,4,(long)pRVar1 - (long)puVar4 >> 2,
               (long)puVar9 - (long)puVar4 >> 2,0);
  }
  return bVar11;
}

Assistant:

bool GlobFilter::matches(StringPtr name) {
  // Get out your computer science books. We're implementing a non-deterministic finite automaton.
  //
  // Our NDFA has one "state" corresponding to each character in the pattern.
  //
  // As you may recall, an NDFA can be transformed into a DFA where every state in the DFA
  // represents some combination of states in the NDFA. Therefore, we actually have to store a
  // list of states here. (Actually, what we really want is a set of states, but because our
  // patterns are mostly non-cyclic a list of states should work fine and be a bit more efficient.)

  // Our state list starts out pointing only at the start of the pattern.
  states.resize(0);
  states.add(0);

  Vector<uint> scratch;

  // Iterate through each character in the name.
  for (char c: name) {
    // Pull the current set of states off to the side, so that we can populate `states` with the
    // new set of states.
    Vector<uint> oldStates = kj::mv(states);
    states = kj::mv(scratch);
    states.resize(0);

    // The pattern can omit a leading path. So if we're at a '/' then enter the state machine at
    // the beginning on the next char.
    if (c == '/' || c == '\\') {
      states.add(0);
    }

    // Process each state.
    for (uint state: oldStates) {
      applyState(c, state);
    }

    // Store the previous state vector for reuse.
    scratch = kj::mv(oldStates);
  }

  // If any one state is at the end of the pattern (or at a wildcard just before the end of the
  // pattern), we have a match.
  for (uint state: states) {
    while (state < pattern.size() && pattern[state] == '*') {
      ++state;
    }
    if (state == pattern.size()) {
      return true;
    }
  }
  return false;
}